

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

string * __thiscall
tinyformat::format<long,std::__cxx11::string,std::__cxx11::string,unsigned_long,unsigned_long>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,long *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          unsigned_long *args_3,unsigned_long *args_4)

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream local_1b0 [376];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  format<long,std::__cxx11::string,std::__cxx11::string,unsigned_long,unsigned_long>
            ((ostream *)local_1b0,(char *)this,(long *)fmt,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,args_1,
             (unsigned_long *)args_2,args_3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}